

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall Lowerer::GenerateFastBrBool(Lowerer *this,BranchInstr *instr)

{
  short sVar1;
  Func *pFVar2;
  LabelInstr *target;
  code *pcVar3;
  LabelInstr *target_00;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ObjectType OVar7;
  OpCode OVar8;
  uint32 uVar9;
  undefined4 *puVar10;
  Instr *pIVar11;
  Opnd *pOVar12;
  LabelInstr *target_01;
  LabelInstr *target_02;
  RegOpnd *pRVar13;
  LabelInstr *pLVar14;
  IndirOpnd *pIVar15;
  IntConstOpnd *pIVar16;
  BranchInstr *pBVar17;
  Lowerer *pLVar18;
  undefined1 local_f0 [8];
  AutoReuseOpnd autoReuseSrc;
  anon_class_48_6_08bc57de EnsureObjectTest;
  AutoReuseOpnd autoReuseToBoolDst;
  byte local_7b;
  short local_7a;
  bool _didObjectTest;
  LabelInstr *pLStack_78;
  LabelInstr *labelHelper;
  Lowerer *local_68;
  LabelInstr *local_60;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_52;
  Func *pFStack_50;
  ValueType srcOriginalValueType;
  Func *func;
  RegOpnd *src;
  BranchInstr *instr_local;
  ValueType srcValueType;
  
  local_68 = this;
  src = (RegOpnd *)instr;
  if (instr == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5fc9,"(instr)","instr");
    if (!bVar4) goto LAB_005595ce;
    *puVar10 = 0;
  }
  if (((instr->super_Instr).m_opcode & ~ExtendedOpcodePrefix) != BrFalse_A) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5fca,
                       "(instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A)"
                       ,
                       "instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A"
                      );
    if (!bVar4) goto LAB_005595ce;
    *puVar10 = 0;
  }
  pFVar2 = (instr->super_Instr).m_func;
  pFStack_50 = pFVar2;
  bVar4 = IR::Opnd::IsRegOpnd((instr->super_Instr).m_src1);
  if (!bVar4) {
    pIVar11 = IR::Instr::HoistSrc1(&instr->super_Instr,Ld_A,RegNOREG,(StackSym *)0x0);
    LowererMD::ChangeToAssign(pIVar11);
  }
  pOVar12 = IR::Opnd::Copy((instr->super_Instr).m_src1,pFVar2);
  func = (Func *)IR::Opnd::AsRegOpnd(pOVar12);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_f0,(Opnd *)func,pFVar2,true);
  local_52 = *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&func->m_runtimeInfo;
  target = *(LabelInstr **)&src[3].super_Opnd.m_valueType;
  instr_local._6_2_ = local_52;
  target_01 = IR::Instr::GetOrCreateContinueLabel((Instr *)src,false);
  if (target == target_01) {
    IR::Instr::Remove((Instr *)src);
    goto LAB_00558ae6;
  }
  sVar1 = *(short *)&src[1].m_sym;
  target_02 = target_01;
  target_00 = target;
  if (sVar1 != 0xe) {
    target_02 = target;
    target_00 = target_01;
  }
  pOVar12 = *(Opnd **)&src[2].super_Opnd.m_valueType;
  if (pOVar12->m_type == TyFloat64) {
    InsertFloatCheckForZeroOrNanBranch
              ((Lowerer *)src,pOVar12,sVar1 == 0xe,target,target_01,(Instr *)src);
    InsertBranch(Br,target_01,(Instr *)src);
  }
  else {
    local_7a = sVar1;
    bVar4 = ValueType::HasBeenNull((ValueType *)((long)&instr_local + 6));
    if ((!bVar4) && (bVar4 = ValueType::IsUninitialized((ValueType *)&local_52.field_0), !bVar4)) {
LAB_00558a3f:
      bVar4 = ValueType::HasBeenUndefined((ValueType *)((long)&instr_local + 6));
      if ((bVar4) || (bVar4 = ValueType::IsUninitialized((ValueType *)&local_52.field_0), bVar4)) {
        bVar4 = ValueType::IsUndefined((ValueType *)((long)&instr_local + 6));
        pFVar2 = func;
        if (bVar4) {
          InsertBranch(Br,target_00,(Instr *)src);
          if (*(char *)(*(long *)&src->field_0x18 + 0x39) == '\x02') goto LAB_00558ae1;
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x6016,"(instr->m_prev->IsBranchInstr())",
                             "instr->m_prev->IsBranchInstr()");
          goto LAB_00558ad2;
        }
        pLVar18 = local_68;
        pOVar12 = LoadLibraryValueOpnd(local_68,(Instr *)src,ValueUndefined);
        InsertCompareBranch(pLVar18,(Opnd *)pFVar2,pOVar12,BrEq_A,target_00,(Instr *)src,false);
        pFVar2 = func;
        instr_local._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetIsNotAnyOf((ValueType *)((long)&instr_local + 6),(ValueType)0x2);
        IR::Opnd::SetValueType((Opnd *)pFVar2,(ValueType)instr_local._6_2_);
      }
      bVar4 = IR::Opnd::IsNotInt((Opnd *)func);
      bVar5 = ValueType::HasBeenInt((ValueType *)((long)&instr_local + 6));
      labelHelper._4_4_ = sVar1 == 0xe ^ 0xd;
      if ((bVar5) ||
         (bVar5 = ValueType::HasBeenUnknownNumber((ValueType *)((long)&instr_local + 6)), bVar5)) {
        if (!bVar4) goto LAB_00558baa;
        bVar4 = true;
LAB_00558cb8:
        local_60 = (LabelInstr *)0x0;
      }
      else {
        bVar5 = ValueType::IsUninitialized((ValueType *)&local_52.field_0);
        if (!bVar5 || bVar4) goto LAB_00558cb8;
LAB_00558baa:
        bVar4 = IR::Opnd::IsTaggedInt((Opnd *)func);
        if (bVar4) {
          local_60 = (LabelInstr *)0x0;
        }
        else {
          local_60 = IR::LabelInstr::New(Label,pFStack_50,false);
          LowererMD::GenerateSmIntTest
                    (&local_68->m_lowererMD,(Opnd *)func,(Instr *)src,local_60,(Instr **)0x0,false);
        }
        LowererMD::GenerateTaggedZeroTest
                  (&local_68->m_lowererMD,(Opnd *)func,(Instr *)src,(LabelInstr *)0x0);
        InsertBranch((OpCode)labelHelper._4_4_,target,(Instr *)src);
        bVar4 = IR::Opnd::IsTaggedInt((Opnd *)func);
        if (bVar4) {
          if (*(char *)(*(long *)&src->field_0x18 + 0x39) != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x6044,"(instr->m_prev->IsBranchInstr())",
                               "instr->m_prev->IsBranchInstr()");
            if (!bVar4) goto LAB_005595ce;
            *puVar10 = 0;
          }
          IR::Instr::Remove((Instr *)src);
          goto LAB_00558ae6;
        }
        InsertBranch(Br,target_01,(Instr *)src);
        bVar4 = true;
        if (local_60 == (LabelInstr *)0x0) goto LAB_00558cb8;
        IR::Instr::InsertBefore((Instr *)src,&local_60->super_Instr);
      }
      bVar5 = ValueType::IsLikelyFloat((ValueType *)((long)&instr_local + 6));
      bVar6 = ValueType::IsNotNumber((ValueType *)((long)&instr_local + 6));
      if (bVar5) {
        local_60 = IR::LabelInstr::New(Label,pFStack_50,false);
        if (bVar4 == false) {
          LowererMD::GenerateSmIntTest
                    (&local_68->m_lowererMD,(Opnd *)func,(Instr *)src,local_60,(Instr **)0x0,true);
        }
        pLVar18 = (Lowerer *)&local_68->m_lowererMD;
        pRVar13 = LowererMD::CheckFloatAndUntag
                            ((LowererMD *)pLVar18,(RegOpnd *)func,(Instr *)src,local_60);
        InsertFloatCheckForZeroOrNanBranch
                  (pLVar18,&pRVar13->super_Opnd,local_7a == 0xe,target,target_01,(Instr *)src);
        InsertBranch(Br,target_01,(Instr *)src);
        IR::Instr::InsertBefore((Instr *)src,&local_60->super_Instr);
        pFVar2 = func;
        instr_local._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetIsNotAnyOf((ValueType *)((long)&instr_local + 6),(ValueType)0x3e0);
        bVar6 = true;
        IR::Opnd::SetValueType((Opnd *)pFVar2,(ValueType)instr_local._6_2_);
        bVar4 = true;
      }
      EnsureObjectTest._didObjectTest = (bool *)&stack0xffffffffffffff88;
      pLStack_78 = (LabelInstr *)0x0;
      local_7b = bVar6 & bVar4;
      autoReuseSrc._16_8_ = &local_7b;
      EnsureObjectTest.labelHelper = (LabelInstr **)&stack0xffffffffffffffb0;
      EnsureObjectTest.func = &local_68->m_func;
      EnsureObjectTest.this = (Lowerer *)&func;
      EnsureObjectTest.src = &src;
      bVar4 = ValueType::HasBeenBoolean((ValueType *)((long)&instr_local + 6));
      if ((bVar4) || (bVar4 = ValueType::IsUninitialized((ValueType *)&local_52.field_0), bVar4)) {
        bVar4 = ValueType::IsBoolean((ValueType *)((long)&instr_local + 6));
        if (bVar4) {
          pLVar14 = (LabelInstr *)0x0;
        }
        else {
          GenerateFastBrBool::anon_class_48_6_08bc57de::operator()
                    ((anon_class_48_6_08bc57de *)&autoReuseSrc.autoDelete);
          pLVar14 = IR::LabelInstr::New(Label,pFStack_50,false);
          pIVar15 = IR::IndirOpnd::New((RegOpnd *)func,0,TyUint64,pFStack_50,false);
          pLVar18 = local_68;
          pOVar12 = LoadVTableValueOpnd(local_68,(Instr *)src,VtableJavascriptBoolean);
          InsertCompareBranch(pLVar18,&pIVar15->super_Opnd,pOVar12,BrNeq_A,pLVar14,(Instr *)src,
                              false);
        }
        pFVar2 = func;
        pLVar18 = local_68;
        pOVar12 = LoadLibraryValueOpnd(local_68,(Instr *)src,ValueFalse);
        InsertCompareBranch(pLVar18,(Opnd *)pFVar2,pOVar12,(OpCode)labelHelper._4_4_,target,
                            (Instr *)src,false);
        bVar4 = ValueType::IsBoolean((ValueType *)((long)&instr_local + 6));
        if (bVar4) {
          if (pLStack_78 != (LabelInstr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60bc,"(!labelHelper)","!labelHelper");
            if (!bVar4) goto LAB_005595ce;
            *puVar10 = 0;
          }
          if (*(char *)(*(long *)&src->field_0x18 + 0x39) != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60bd,"(instr->m_prev->IsBranchInstr())",
                               "instr->m_prev->IsBranchInstr()");
            if (!bVar4) goto LAB_005595ce;
            *puVar10 = 0;
          }
          IR::Instr::Remove((Instr *)src);
          goto LAB_00558ae6;
        }
        InsertBranch(Br,target_01,(Instr *)src);
        if (pLVar14 != (LabelInstr *)0x0) {
          IR::Instr::InsertBefore((Instr *)src,&pLVar14->super_Instr);
          local_60 = pLVar14;
        }
        pFVar2 = func;
        instr_local._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetIsNotAnyOf((ValueType *)((long)&instr_local + 6),(ValueType)0x400);
        IR::Opnd::SetValueType((Opnd *)pFVar2,(ValueType)instr_local._6_2_);
      }
      bVar4 = ValueType::HasBeenString((ValueType *)((long)&instr_local + 6));
      if (bVar4) {
        bVar4 = ValueType::IsString((ValueType *)((long)&instr_local + 6));
        if (bVar4) {
          pLVar14 = (LabelInstr *)0x0;
        }
        else {
          GenerateFastBrBool::anon_class_48_6_08bc57de::operator()
                    ((anon_class_48_6_08bc57de *)&autoReuseSrc.autoDelete);
          pLVar14 = IR::LabelInstr::New(Label,pFStack_50,false);
          GenerateStringTest(local_68,(RegOpnd *)func,(Instr *)src,pLVar14,(LabelInstr *)0x0,false);
        }
        pIVar15 = IR::IndirOpnd::New((RegOpnd *)func,0x18,TyUint32,pFStack_50,false);
        pLVar18 = (Lowerer *)0x0;
        pIVar16 = IR::IntConstOpnd::New(0,TyUint32,pFStack_50,true);
        InsertCompareBranch(pLVar18,&pIVar15->super_Opnd,&pIVar16->super_Opnd,
                            (OpCode)labelHelper._4_4_,target,(Instr *)src,false);
        bVar4 = ValueType::IsString((ValueType *)((long)&instr_local + 6));
        if (bVar4) {
          if (pLStack_78 != (LabelInstr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60e8,"(!labelHelper)","!labelHelper");
            if (!bVar4) goto LAB_005595ce;
            *puVar10 = 0;
          }
          if (*(char *)(*(long *)&src->field_0x18 + 0x39) != '\x02') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar10 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                               ,0x60e9,"(instr->m_prev->IsBranchInstr())",
                               "instr->m_prev->IsBranchInstr()");
            if (!bVar4) goto LAB_005595ce;
            *puVar10 = 0;
          }
          IR::Instr::Remove((Instr *)src);
          goto LAB_00558ae6;
        }
        InsertBranch(Br,target_01,(Instr *)src);
        if (pLVar14 != (LabelInstr *)0x0) {
          IR::Instr::InsertBefore((Instr *)src,&pLVar14->super_Instr);
          local_60 = pLVar14;
        }
        pFVar2 = func;
        instr_local._6_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetIsNotAnyOf((ValueType *)((long)&instr_local + 6),(ValueType)0x800);
        IR::Opnd::SetValueType((Opnd *)pFVar2,(ValueType)instr_local._6_2_);
      }
      bVar4 = ValueType::IsLikelyObject((ValueType *)((long)&instr_local + 6));
      if (bVar4) {
        bVar4 = ValueType::IsObject((ValueType *)((long)&instr_local + 6));
        if (bVar4) {
          OVar7 = ValueType::GetObjectType((ValueType *)((long)&instr_local + 6));
          if (Object < OVar7) {
            InsertBranch(Br,target_02,(Instr *)src);
            if (pLStack_78 != (LabelInstr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar10 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x6108,"(!labelHelper)","!labelHelper");
              if (!bVar4) goto LAB_005595ce;
              *puVar10 = 0;
            }
            if (*(char *)(*(long *)&src->field_0x18 + 0x39) != '\x02') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar10 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x6109,"(instr->m_prev->IsBranchInstr())",
                                 "instr->m_prev->IsBranchInstr()");
              if (!bVar4) goto LAB_005595ce;
              *puVar10 = 0;
            }
            IR::Instr::Remove((Instr *)src);
            goto LAB_00558ae6;
          }
        }
        else {
          GenerateFastBrBool::anon_class_48_6_08bc57de::operator()
                    ((anon_class_48_6_08bc57de *)&autoReuseSrc.autoDelete);
        }
        pRVar13 = IR::RegOpnd::New(TyUint64,pFStack_50);
        IR::AutoReuseOpnd::AutoReuseOpnd
                  ((AutoReuseOpnd *)&EnsureObjectTest.instr,&pRVar13->super_Opnd,pFStack_50,true);
        pIVar15 = IR::IndirOpnd::New((RegOpnd *)func,8,TyUint64,pFStack_50,false);
        InsertMove(&pRVar13->super_Opnd,&pIVar15->super_Opnd,(Instr *)src,true);
        uVar9 = Js::Type::GetOffsetOfFlags();
        pIVar15 = IR::IndirOpnd::New(pRVar13,uVar9,TyUint8,pFStack_50,false);
        pIVar16 = IR::IntConstOpnd::New(2,TyUint8,pFStack_50,false);
        InsertTestBranch(&pIVar15->super_Opnd,&pIVar16->super_Opnd,BrNeq_A,target_00,(Instr *)src);
        uVar9 = Js::Type::GetOffsetOfTypeId();
        pIVar15 = IR::IndirOpnd::New(pRVar13,uVar9,TyInt32,pFStack_50,false);
        pLVar18 = (Lowerer *)0x16;
        pIVar16 = IR::IntConstOpnd::New(0x16,TyInt32,pFStack_50,false);
        InsertCompareBranch(pLVar18,&pIVar15->super_Opnd,&pIVar16->super_Opnd,BrGt_A,true,target_02,
                            (Instr *)src,false);
        if (pLStack_78 == (LabelInstr *)0x0) {
          pLStack_78 = IR::LabelInstr::New(Label,pFStack_50,true);
        }
        IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&EnsureObjectTest.instr);
      }
      else if (local_60 != (LabelInstr *)0x0) {
        if (*(LabelInstr **)&src->field_0x18 != local_60) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x6138,"(instr->m_prev == lastLabelBeforeHelper)",
                             "instr->m_prev == lastLabelBeforeHelper");
          if (!bVar4) goto LAB_005595ce;
          *puVar10 = 0;
        }
        local_60->field_0x78 = local_60->field_0x78 | 2;
      }
      if (pLStack_78 != (LabelInstr *)0x0) {
        if ((pLStack_78->field_0x78 & 2) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x613d,"(labelHelper->isOpHelper)","labelHelper->isOpHelper");
          if (!bVar4) goto LAB_005595ce;
          *puVar10 = 0;
        }
        IR::Instr::InsertBefore((Instr *)src,&pLStack_78->super_Instr);
      }
      pRVar13 = IR::RegOpnd::New(TyInt32,pFStack_50);
      IR::AutoReuseOpnd::AutoReuseOpnd
                ((AutoReuseOpnd *)&EnsureObjectTest.instr,&pRVar13->super_Opnd,pFStack_50,true);
      pIVar11 = IR::Instr::New(Call,&pRVar13->super_Opnd,*(Opnd **)&src[2].super_Opnd.m_valueType,
                               pFStack_50);
      IR::Instr::InsertBefore((Instr *)src,pIVar11);
      LowerUnaryHelperMem(local_68,pIVar11,HelperConv_ToBoolean,(Opnd *)0x0);
      InsertTest(&pRVar13->super_Opnd,&pRVar13->super_Opnd,(Instr *)src);
      if (src[1].m_reg != RegArg3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x614c,"(instr->IsBranchInstr())","instr->IsBranchInstr()");
        if (!bVar4) goto LAB_005595ce;
        *puVar10 = 0;
      }
      IR::Instr::FreeSrc1((Instr *)src);
      OVar8 = LowererMD::MDBranchOpcode((OpCode)labelHelper._4_4_);
      *(OpCode *)&src[1].m_sym = OVar8;
      pBVar17 = IR::Instr::AsBranchInstr((Instr *)src);
      if (pBVar17->m_branchTarget != target) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar10 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x614f,"(instr->AsBranchInstr()->GetTarget() == labelTarget)",
                           "instr->AsBranchInstr()->GetTarget() == labelTarget");
        if (!bVar4) {
LAB_005595ce:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar10 = 0;
      }
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&EnsureObjectTest.instr);
      goto LAB_00558ae6;
    }
    bVar4 = ValueType::IsNull((ValueType *)((long)&instr_local + 6));
    pFVar2 = func;
    if (!bVar4) {
      pLVar18 = local_68;
      pOVar12 = LoadLibraryValueOpnd(local_68,(Instr *)src,ValueNull);
      InsertCompareBranch(pLVar18,(Opnd *)pFVar2,pOVar12,BrEq_A,target_00,(Instr *)src,false);
      pFVar2 = func;
      instr_local._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetIsNotAnyOf((ValueType *)((long)&instr_local + 6),(ValueType)0x4);
      IR::Opnd::SetValueType((Opnd *)pFVar2,(ValueType)instr_local._6_2_);
      goto LAB_00558a3f;
    }
    InsertBranch(Br,target_00,(Instr *)src);
    if (*(char *)(*(long *)&src->field_0x18 + 0x39) == '\x02') goto LAB_00558ae1;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5ffa,"(instr->m_prev->IsBranchInstr())","instr->m_prev->IsBranchInstr()");
LAB_00558ad2:
    if (bVar4 == false) goto LAB_005595ce;
    *puVar10 = 0;
  }
LAB_00558ae1:
  IR::Instr::Remove((Instr *)src);
LAB_00558ae6:
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_f0);
  return false;
}

Assistant:

bool Lowerer::GenerateFastBrBool(IR::BranchInstr *const instr)
{
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A);

    Func *const func = instr->m_func;

    if(!instr->GetSrc1()->IsRegOpnd())
    {
        LowererMD::ChangeToAssign(instr->HoistSrc1(Js::OpCode::Ld_A));
    }
    IR::RegOpnd *const src = instr->GetSrc1()->Copy(func)->AsRegOpnd();
    const IR::AutoReuseOpnd autoReuseSrc(src, func);
    const ValueType srcOriginalValueType(src->GetValueType());
    ValueType srcValueType(srcOriginalValueType);

    IR::LabelInstr *const labelTarget = instr->GetTarget();
    IR::LabelInstr *const labelFallthrough = instr->GetOrCreateContinueLabel();
    if(labelTarget == labelFallthrough)
    {
        // Nothing to do
        instr->Remove();
        return false;
    }

    const bool branchOnFalse = instr->m_opcode == Js::OpCode::BrFalse_A;
    IR::LabelInstr *const labelFalse = branchOnFalse ? labelTarget : labelFallthrough;
    IR::LabelInstr *const labelTrue = branchOnFalse ? labelFallthrough : labelTarget;
    const Js::OpCode compareWithFalseBranchToTargetOpCode = branchOnFalse ? Js::OpCode::BrEq_A : Js::OpCode::BrNeq_A;
    IR::LabelInstr *lastLabelBeforeHelper = nullptr;

    /// Typespec'd float
    if (instr->GetSrc1()->GetType() == TyFloat64)
    {
        InsertFloatCheckForZeroOrNanBranch(instr->GetSrc1(), branchOnFalse, labelTarget, labelFallthrough, instr);
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);
        instr->Remove();
        return false;
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Null fast path

    if (srcValueType.HasBeenNull() || srcOriginalValueType.IsUninitialized())
    {
        if(srcValueType.IsNull())
        {
            //     jmp $false
            InsertBranch(Js::OpCode::Br, labelFalse, instr);

            // Skip lowering call to helper
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     cmp src, null
        //     je $false
        InsertCompareBranch(
            src,
            LoadLibraryValueOpnd(instr, LibraryValue::ValueNull),
            Js::OpCode::BrEq_A,
            labelFalse,
            instr);

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::Null));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Undefined fast path

    if(srcValueType.HasBeenUndefined() || srcOriginalValueType.IsUninitialized())
    {
        if(srcValueType.IsUndefined())
        {
            //     jmp $false
            InsertBranch(Js::OpCode::Br, labelFalse, instr);

            // Skip lowering call to helper
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     cmp src, undefined
        //     je $false
        InsertCompareBranch(
            src,
            LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined),
            Js::OpCode::BrEq_A,
            labelFalse,
            instr);

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::Undefined));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Tagged int fast path

    const bool isNotInt = src->IsNotInt();
    bool checkedForTaggedInt = isNotInt;
    if( (
            srcValueType.HasBeenInt() ||
            srcValueType.HasBeenUnknownNumber() ||
            srcOriginalValueType.IsUninitialized()
        ) && !isNotInt)
    {
        checkedForTaggedInt = true;
        IR::LabelInstr *notTaggedIntLabel = nullptr;
        if(!src->IsTaggedInt())
        {
            //     test src, 1
            //     jz $notTaggedInt
            notTaggedIntLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            m_lowererMD.GenerateSmIntTest(src, instr, notTaggedIntLabel);
        }

        //     cmp src, tag(0)
        //     je/jne $target
        m_lowererMD.GenerateTaggedZeroTest(src, instr);
        Lowerer::InsertBranch(compareWithFalseBranchToTargetOpCode, labelTarget, instr);

        if(src->IsTaggedInt())
        {
            // Skip lowering call to helper
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     jmp $fallthrough
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        // $notTaggedInt:
        if(notTaggedIntLabel)
        {
            instr->InsertBefore(notTaggedIntLabel);
            lastLabelBeforeHelper = notTaggedIntLabel;
        }
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Float fast path

    bool generateFloatTest = srcValueType.IsLikelyFloat();
#ifdef _M_IX86
    if (!AutoSystemInfo::Data.SSE2Available())
    {
        generateFloatTest = false;
    }
#endif
    bool checkedForTaggedFloat =
#if FLOATVAR
        srcValueType.IsNotNumber();
#else
        true; // there are no tagged floats, indicate that it has been checked
#endif
    if (generateFloatTest)
    {
        // if(srcValueType.IsFloat()) // skip tagged int check?
        //
        // ValueType::IsFloat() does not guarantee that the storage is not in a tagged int.
        // The tagged int check is necessary. It does, however, guarantee that as long as the value is not
        // stored in a tagged int, that it is definitely stored in a JavascriptNumber/TaggedFloat.

        IR::LabelInstr *const notFloatLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
        if(!checkedForTaggedInt)
        {
            checkedForTaggedInt = true;
            m_lowererMD.GenerateSmIntTest(src, instr, notFloatLabel, nullptr, true);
        }

        //     cmp [src], JavascriptNumber::vtable
        //     jne $notFloat
    #if FLOATVAR
        checkedForTaggedFloat = true;
        IR::RegOpnd *const floatOpnd = m_lowererMD.CheckFloatAndUntag(src, instr, notFloatLabel);
    #else
        m_lowererMD.GenerateFloatTest(src, instr, notFloatLabel);
        IR::IndirOpnd *const floatOpnd = IR::IndirOpnd::New(src, Js::JavascriptNumber::GetValueOffset(), TyMachDouble, func);
    #endif

        //     cmp src, 0.0
        //     jp $false
        //     je/jne $target
        //     jmp $fallthrough
        InsertFloatCheckForZeroOrNanBranch(floatOpnd, branchOnFalse, labelTarget, labelFallthrough, instr);
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        // $notFloat:
        instr->InsertBefore(notFloatLabel);
        lastLabelBeforeHelper = notFloatLabel;

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::AnyNumber));
    }

    IR::LabelInstr *labelHelper = nullptr;
    bool _didObjectTest = checkedForTaggedInt && checkedForTaggedFloat;
    const auto EnsureObjectTest = [&]()
    {
        if(_didObjectTest)
        {
            return;
        }
        if(!labelHelper)
        {
            labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        m_lowererMD.GenerateObjectTest(src, instr, labelHelper);
        _didObjectTest = true;
    };

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Boolean fast path

    if (srcValueType.HasBeenBoolean() || srcOriginalValueType.IsUninitialized())
    {
        IR::LabelInstr *notBooleanLabel = nullptr;
        if (!srcValueType.IsBoolean())
        {
            EnsureObjectTest();

            //     cmp [src], JavascriptBoolean::vtable
            //     jne $notBoolean
            notBooleanLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            InsertCompareBranch(
                IR::IndirOpnd::New(src, 0, TyMachPtr, func),
                LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptBoolean),
                Js::OpCode::BrNeq_A,
                notBooleanLabel,
                instr);
        }

        //     cmp src, false
        //     je/jne $target
        InsertCompareBranch(
            src,
            LoadLibraryValueOpnd(instr, LibraryValue::ValueFalse),
            compareWithFalseBranchToTargetOpCode,
            labelTarget,
            instr);

        if (srcValueType.IsBoolean())
        {
            // Skip lowering call to helper
            Assert(!labelHelper);
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }
        //     jmp $fallthrough
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        if (notBooleanLabel)
        {
            instr->InsertBefore(notBooleanLabel);
            lastLabelBeforeHelper = notBooleanLabel;

        }

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::Boolean));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // String fast path

    if(srcValueType.HasBeenString())
    {
        IR::LabelInstr *notStringLabel = nullptr;
        if(!srcValueType.IsString())
        {
            EnsureObjectTest();

            notStringLabel = IR::LabelInstr::New(Js::OpCode::Label, func);
            GenerateStringTest(src, instr, notStringLabel, nullptr, false);
        }

        //     cmp [src + offset(length)], 0
        //     jeq/jne $target
        InsertCompareBranch(
            IR::IndirOpnd::New(src, Js::JavascriptString::GetOffsetOfcharLength(), TyUint32, func),
            IR::IntConstOpnd::New(0, TyUint32, func, true),
            compareWithFalseBranchToTargetOpCode,
            labelTarget,
            instr);

        if(srcValueType.IsString())
        {
            // Skip lowering call to helper
            Assert(!labelHelper);
            Assert(instr->m_prev->IsBranchInstr());
            instr->Remove();
            return false;
        }

        //     jmp $fallthrough
        Lowerer::InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        if(notStringLabel)
        {
            instr->InsertBefore(notStringLabel);
            lastLabelBeforeHelper = notStringLabel;
        }

        src->SetValueType(srcValueType = srcValueType.SetIsNotAnyOf(ValueType::String));
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Object fast path

    if (srcValueType.IsLikelyObject())
    {
        if(srcValueType.IsObject())
        {
            if(srcValueType.GetObjectType() > ObjectType::Object)
            {
                // Specific object types that are tracked are equivalent to 'true'
                //     jmp $true
                InsertBranch(Js::OpCode::Br, labelTrue, instr);

                // Skip lowering call to helper
                Assert(!labelHelper);
                Assert(instr->m_prev->IsBranchInstr());
                instr->Remove();
                return false;
            }
        }
        else
        {
            EnsureObjectTest();
        }

        //     mov srcType, [src + offset(type)]       -- load type
        IR::RegOpnd *const srcType = IR::RegOpnd::New(TyMachPtr, func);
        const IR::AutoReuseOpnd autoReuseR1(srcType, func);
        InsertMove(srcType, IR::IndirOpnd::New(src, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, func), instr);

        //     test [srcType + offset(flags)], TypeFlagMask_IsFalsy       -- check  if falsy
        //     jnz $false
        InsertTestBranch(
            IR::IndirOpnd::New(srcType, Js::Type::GetOffsetOfFlags(), TyUint8, func),
            IR::IntConstOpnd::New(TypeFlagMask_IsFalsy, TyUint8, func),
            Js::OpCode::BrNeq_A,
            labelFalse,
            instr);

        //     cmp [srcType + offset(typeId)], TypeIds_LastJavascriptPrimitiveType  -- check base TypeIds_LastJavascriptPrimitiveType
        //     ja $true
        InsertCompareBranch(
            IR::IndirOpnd::New(srcType, Js::Type::GetOffsetOfTypeId(), TyInt32, func),
            IR::IntConstOpnd::New(Js::TypeIds_LastJavascriptPrimitiveType, TyInt32, func),
            Js::OpCode::BrGt_A,
            true /* isUnsigned */,
            labelTrue,
            instr);

        if(!labelHelper)
        {
            labelHelper = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        }
        lastLabelBeforeHelper = nullptr;
    }

    ////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////////
    // Helper call

    // $helper:
    if(lastLabelBeforeHelper)
    {
        Assert(instr->m_prev == lastLabelBeforeHelper);
        lastLabelBeforeHelper->isOpHelper = true;
    }
    if (labelHelper)
    {
        Assert(labelHelper->isOpHelper);
        instr->InsertBefore(labelHelper);
    }

    //     call JavascriptConversion::ToBoolean
    IR::RegOpnd *const toBoolDst = IR::RegOpnd::New(TyInt32, func);
    const IR::AutoReuseOpnd autoReuseToBoolDst(toBoolDst, func);
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, toBoolDst, instr->GetSrc1(), func);
    instr->InsertBefore(callInstr);
    LowerUnaryHelperMem(callInstr, IR::HelperConv_ToBoolean);

    //     test eax, eax
    InsertTest(toBoolDst, toBoolDst, instr);

    //     je/jne $target
    Assert(instr->IsBranchInstr());
    instr->FreeSrc1();
    instr->m_opcode = LowererMD::MDBranchOpcode(compareWithFalseBranchToTargetOpCode);
    Assert(instr->AsBranchInstr()->GetTarget() == labelTarget);

    // Skip lowering another call to helper
    return false;
}